

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O3

void __thiscall
nv::SlowCompressor::compressDXT3
          (SlowCompressor *this,Private *compressionOptions,Private *outputOptions)

{
  OutputHandler *pOVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  BlockDXT3 block;
  ColorBlock rgba;
  WeightedClusterFit fit;
  ColourSet colours;
  anon_union_4_2_12391d8d_for_Color32_0 local_59c;
  SlowCompressor *local_598;
  Private *local_590;
  AlphaBlockDXT3 local_588;
  BlockDXT1 local_580;
  anon_union_4_2_12391d8d_for_Color32_0 local_578 [16];
  WeightedClusterFit local_538;
  ColourSet local_388;
  
  local_590 = outputOptions;
  uVar3 = Image::width(this->m_image);
  local_598 = this;
  uVar4 = Image::height(this->m_image);
  ColorBlock::ColorBlock((ColorBlock *)&local_578[0].field_0);
  squish::WeightedClusterFit::WeightedClusterFit(&local_538);
  squish::WeightedClusterFit::SetMetric
            (&local_538,(compressionOptions->colorWeight).m_x,(compressionOptions->colorWeight).m_y,
             (compressionOptions->colorWeight).m_z);
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      if (uVar3 != 0) {
        uVar5 = 0;
        do {
          ColorBlock::init((ColorBlock *)&local_578[0].field_0,(EVP_PKEY_CTX *)local_598->m_image);
          OptimalCompress::compressDXT3A((ColorBlock *)&local_578[0].field_0,&local_588);
          bVar2 = ColorBlock::isSingleColor((ColorBlock *)&local_578[0].field_0);
          if (bVar2) {
            local_59c = local_578[0];
            OptimalCompress::compressDXT1((Color32 *)&local_59c.field_0,&local_580);
          }
          else {
            squish::ColourSet::ColourSet(&local_388,(u8 *)&local_578[0].u,0x80,false);
            squish::WeightedClusterFit::SetColourSet(&local_538,&local_388,0);
            squish::ColourFit::Compress(&local_538.super_ColourFit,&local_580);
          }
          pOVar1 = local_590->outputHandler;
          if (pOVar1 != (OutputHandler *)0x0) {
            (*pOVar1->_vptr_OutputHandler[3])(pOVar1,&local_588,0x10);
          }
          uVar5 = uVar5 + 4;
        } while (uVar5 < uVar3);
      }
      uVar6 = uVar6 + 4;
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void nv::SlowCompressor::compressDXT3(const CompressionOptions::Private & compressionOptions, const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT3 block;
	
	squish::WeightedClusterFit fit;
	//squish::FastClusterFit fit;
	fit.SetMetric(compressionOptions.colorWeight.x(), compressionOptions.colorWeight.y(), compressionOptions.colorWeight.z());

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			
			rgba.init(m_image, x, y);
			
			// Compress explicit alpha.
			OptimalCompress::compressDXT3A(rgba, &block.alpha);

			// Compress color.
			if (rgba.isSingleColor())
			{
				OptimalCompress::compressDXT1(rgba.color(0), &block.color);
			}
			else
			{
				squish::ColourSet colours((uint8 *)rgba.colors(), squish::kWeightColourByAlpha);
				fit.SetColourSet(&colours, 0);
				fit.Compress(&block.color);
			}
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}